

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_read_h2(lws *wsi,uchar *buf,lws_filepos_t len)

{
  uint uVar1;
  lws_filepos_t lStack_38;
  int m;
  lws_filepos_t body_chunk_len;
  uchar *oldbuf;
  lws_filepos_t len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  body_chunk_len = (lws_filepos_t)buf;
  oldbuf = (uchar *)len;
  len_local = (lws_filepos_t)buf;
  buf_local = (uchar *)wsi;
  do {
    if (oldbuf == (uchar *)0x0) {
LAB_0013a6ea:
      return (int)len_local - (int)body_chunk_len;
    }
    if (buf_local[0x488] != '\0') {
      lws_rxflow_cache((lws *)buf_local,(uchar *)len_local,0,(size_t)oldbuf);
      len_local = (lws_filepos_t)(oldbuf + len_local);
      goto LAB_0013a6ea;
    }
    uVar1 = lws_h2_parser((lws *)buf_local,(uchar *)len_local,(lws_filepos_t)oldbuf,
                          &stack0xffffffffffffffc8);
    if ((uVar1 != 0) && (uVar1 != 2)) {
      _lws_log(0x10,"%s: http2_parser bail: %d\n","lws_read_h2",(ulong)uVar1);
      lws_close_free_wsi((lws *)buf_local,LWS_CLOSE_STATUS_NOSTATUS,"lws_read_h2 bail");
      return -1;
    }
    if (uVar1 == 2) {
      len_local = lStack_38 + len_local;
      goto LAB_0013a6ea;
    }
    len_local = lStack_38 + len_local;
    oldbuf = oldbuf + -lStack_38;
  } while( true );
}

Assistant:

int
lws_read_h2(struct lws *wsi, unsigned char *buf, lws_filepos_t len)
{
	unsigned char *oldbuf = buf;
	lws_filepos_t body_chunk_len;

	// lwsl_notice("%s: h2 path: wsistate 0x%x len %d\n", __func__,
	//		wsi->wsistate, (int)len);

	/*
	 * wsi here is always the network connection wsi, not a stream
	 * wsi.  Once we unpicked the framing we will find the right
	 * swsi and make it the target of the frame.
	 *
	 * If it's ws over h2, the nwsi will get us here to do the h2
	 * processing, and that will call us back with the swsi +
	 * ESTABLISHED state for the inner payload, handled in a later
	 * case.
	 */
	while (len) {
		int m;

		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lws_rxflow_cache(wsi, buf, 0, (size_t)len);
			buf += len;
			break;
		}

		/*
		 * lws_h2_parser() may send something; when it gets the
		 * whole frame, it will want to perform some action
		 * involving a reply.  But we may be in a partial send
		 * situation on the network wsi...
		 *
		 * Even though we may be in a partial send and unable to
		 * send anything new, we still have to parse the network
		 * wsi in order to gain tx credit to send, which is
		 * potentially necessary to clear the old partial send.
		 *
		 * ALL network wsi-specific frames are sent by PPS
		 * already, these are sent as a priority on the writable
		 * handler, and so respect partial sends.  The only
		 * problem is when a stream wsi wants to send an, eg,
		 * reply headers frame in response to the parsing
		 * we will do now... the *stream wsi* must stall in a
		 * different state until it is able to do so from a
		 * priority on the WRITABLE callback, same way that
		 * file transfers operate.
		 */

		m = lws_h2_parser(wsi, buf, len, &body_chunk_len);
		if (m && m != 2) {
			lwsl_debug("%s: http2_parser bail: %d\n", __func__, m);
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "lws_read_h2 bail");

			return -1;
		}
		if (m == 2) {
			/* swsi has been closed */
			buf += body_chunk_len;
			break;
		}

		buf += body_chunk_len;
		len -= body_chunk_len;
	}

	return lws_ptr_diff(buf, oldbuf);
}